

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_group.c
# Opt level: O1

void dictionary_perror(char *spec)

{
  perr(spec);
  perr("\n");
  (*(code *)(&DAT_001052f4 + *(int *)(&DAT_001052f4 + (ulong)errnum * 4)))();
  return;
}

Assistant:

void dictionary_perror(const char * spec)
{
	perr(spec);
	perr("\n");
	switch(errnum)
	{
	case DICTIONARY_ERROR_VOID:
		break;
	case DICTIONARY_ERROR_NODICT:
		perr(_("No dictionary loaded"));
		break;
	case DICTIONARY_ERROR_CANNOT_ACCESS_DICTFILE:
		perror(_("Can not open dictionary file"));
		break;
	case DICTIONARY_ERROR_INVALID_DICT:
		perror(_("Invalid dictionary file"));
		break;
	case DICTIONARY_ERROR_INVALID_INDEX:
		perror(_("Invalid dictionary index"));
		break;
	default:
		perr(_("Unknown"));
	}
}